

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

bool sanityCheck(QList<QWidget_*> *widgets,int index,char *where)

{
  bool bVar1;
  long in_FS_OFFSET;
  char local_48 [24];
  char *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_18;
  undefined1 local_16;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((index < 0) || ((ulong)(widgets->d).size <= (ulong)(uint)index)) {
    local_28 = 0x756f207865646e69;
    uStack_20 = 0x6e617220666f2074;
    local_18 = 0x6567;
    local_16 = 0;
  }
  else {
    bVar1 = true;
    if ((widgets->d).ptr[(uint)index] != (QWidget *)0x0) goto LAB_0040a35a;
    local_28 = 0x696f70206c6c756e;
    uStack_20 = CONCAT35(uStack_20._5_3_,0x7265746e);
  }
  local_48[0] = '\x02';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[0x14] = '\0';
  local_48[0x15] = '\0';
  local_48[0x16] = '\0';
  local_48[0x17] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  local_48[0x10] = '\0';
  local_48[0x11] = '\0';
  local_48[0x12] = '\0';
  local_48[0x13] = '\0';
  local_30 = "default";
  bVar1 = false;
  QMessageLogger::warning(local_48,"%s:%s");
LAB_0040a35a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool sanityCheck(const QList<QWidget *> &widgets, const int index, const char *where)
{
    if (Q_UNLIKELY(index < 0 || index >= widgets.size())) {
        const char error[] = "index out of range";
        Q_ASSERT_X(false, where, error);
        qWarning("%s:%s", where, error);
        return false;
    }
    if (Q_UNLIKELY(!widgets.at(index))) {
        const char error[] = "null pointer";
        Q_ASSERT_X(false, where, error);
        qWarning("%s:%s", where, error);
        return false;
    }
    return true;
}